

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O0

ssize_t __thiscall serial::Serial::write(Serial *this,int __fd,void *__buf,size_t __n)

{
  uint8_t *data;
  size_t sVar1;
  undefined4 in_register_00000034;
  ScopedWriteLock local_20;
  ScopedWriteLock lock;
  string *data_local;
  Serial *this_local;
  
  lock.pimpl_ = (SerialImpl *)CONCAT44(in_register_00000034,__fd);
  ScopedWriteLock::ScopedWriteLock(&local_20,this->pimpl_);
  data = (uint8_t *)std::__cxx11::string::c_str();
  sVar1 = std::__cxx11::string::length();
  sVar1 = write_(this,data,sVar1);
  ScopedWriteLock::~ScopedWriteLock(&local_20);
  return sVar1;
}

Assistant:

size_t
Serial::write (const string &data)
{
  ScopedWriteLock lock(this->pimpl_);
  return this->write_ (reinterpret_cast<const uint8_t*>(data.c_str()),
                       data.length());
}